

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O1

void Cec_ManSatAddToStore(Vec_Int_t *vCexStore,Vec_Int_t *vCex,int Out)

{
  long lVar1;
  
  Vec_IntPush(vCexStore,Out);
  if (vCex != (Vec_Int_t *)0x0) {
    Vec_IntPush(vCexStore,vCex->nSize);
    if (0 < vCex->nSize) {
      lVar1 = 0;
      do {
        Vec_IntPush(vCexStore,vCex->pArray[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < vCex->nSize);
    }
    return;
  }
  Vec_IntPush(vCexStore,-1);
  return;
}

Assistant:

void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out )
{
    int i, Entry;
    Vec_IntPush( vCexStore, Out );
    if ( vCex == NULL ) // timeout
    {
        Vec_IntPush( vCexStore, -1 );
        return;
    }
    // write the counter-example
    Vec_IntPush( vCexStore, Vec_IntSize(vCex) );
    Vec_IntForEachEntry( vCex, Entry, i )
        Vec_IntPush( vCexStore, Entry );
}